

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O0

void Tim_ManSetCiRequired(Tim_Man_t *p,int iCi,float Delay)

{
  float Delay_local;
  int iCi_local;
  Tim_Man_t *p_local;
  
  if (p->nCis <= iCi) {
    __assert_fail("iCi < p->nCis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timTime.c"
                  ,0x89,"void Tim_ManSetCiRequired(Tim_Man_t *, int, float)");
  }
  if ((p->fUseTravId != 0) && (p->pCis[iCi].TravId == p->nTravIds)) {
    __assert_fail("!p->fUseTravId || p->pCis[iCi].TravId != p->nTravIds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timTime.c"
                  ,0x8a,"void Tim_ManSetCiRequired(Tim_Man_t *, int, float)");
  }
  p->pCis[iCi].timeReq = Delay;
  p->pCis[iCi].TravId = p->nTravIds;
  return;
}

Assistant:

void Tim_ManSetCiRequired( Tim_Man_t * p, int iCi, float Delay )
{
    assert( iCi < p->nCis );
    assert( !p->fUseTravId || p->pCis[iCi].TravId != p->nTravIds );
    p->pCis[iCi].timeReq = Delay;
    p->pCis[iCi].TravId = p->nTravIds;
}